

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlCountXorImplication(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo,Aig_Obj_t *pCand)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  int local_48;
  int local_44;
  int Counter;
  int k;
  uint *pSimCand;
  uint *pSimLo;
  uint *pSimLi;
  Aig_Obj_t *pCand_local;
  Aig_Obj_t *pObjLo_local;
  Aig_Obj_t *pObjLi_local;
  Ssw_Sml_t *p_local;
  
  local_48 = 0;
  if ((*(ulong *)&pObjLo->field_0x18 >> 3 & 1) != 0) {
    __assert_fail("pObjLo->fPhase == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0xf1,
                  "int Ssw_SmlCountXorImplication(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)"
                 );
  }
  pAVar4 = Aig_Regular(pCand);
  puVar5 = Ssw_ObjSim(p,pAVar4->Id);
  puVar6 = Ssw_ObjSim(p,pObjLi->Id);
  puVar7 = Ssw_ObjSim(p,pObjLo->Id);
  pAVar4 = Aig_Regular(pCand);
  uVar1 = *(ulong *)&pAVar4->field_0x18;
  uVar2 = Aig_IsComplement(pCand);
  if (((uint)(uVar1 >> 3) & 1) == uVar2) {
    for (local_44 = p->nWordsPref; local_44 < p->nWordsTotal; local_44 = local_44 + 1) {
      iVar3 = Aig_WordCountOnes(puVar5[local_44] &
                                (puVar6[local_44] ^ puVar7[local_44] ^ 0xffffffff));
      local_48 = iVar3 + local_48;
    }
  }
  else {
    for (local_44 = p->nWordsPref; local_44 < p->nWordsTotal; local_44 = local_44 + 1) {
      iVar3 = Aig_WordCountOnes((puVar5[local_44] ^ 0xffffffff) &
                                (puVar6[local_44] ^ puVar7[local_44] ^ 0xffffffff));
      local_48 = iVar3 + local_48;
    }
  }
  return local_48;
}

Assistant:

int Ssw_SmlCountXorImplication( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo, Aig_Obj_t * pCand )
{
    unsigned * pSimLi, * pSimLo, * pSimCand;
    int k, Counter = 0;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimCand = Ssw_ObjSim( p, Aig_Regular(pCand)->Id );
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    if ( Aig_Regular(pCand)->fPhase ^ Aig_IsComplement(pCand) )
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(~pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    else
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            Counter += Aig_WordCountOnes(pSimCand[k] & ~(pSimLi[k] ^ pSimLo[k]));
    }
    return Counter;
}